

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_ssadd64_mips(void *d,void *a,void *b,uint32_t desc)

{
  ulong uVar1;
  intptr_t oprsz_00;
  ulong uVar2;
  ulong local_50;
  int64_t di;
  int64_t bi;
  int64_t ai;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (ai = 0; ai < oprsz_00; ai = ai + 8) {
    uVar1 = *(ulong *)((long)a + ai);
    uVar2 = uVar1 + *(ulong *)((long)b + ai);
    local_50 = uVar2;
    if (((long)((uVar2 ^ uVar1) & (uVar1 ^ *(ulong *)((long)b + ai) ^ 0xffffffffffffffff)) < 0) &&
       (local_50 = 0x8000000000000000, (long)uVar2 < 0)) {
      local_50 = 0x7fffffffffffffff;
    }
    *(ulong *)((long)d + ai) = local_50;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_ssadd64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t ai = *(int64_t *)((char *)a + i);
        int64_t bi = *(int64_t *)((char *)b + i);
        int64_t di = ai + bi;
        if (((di ^ ai) &~ (ai ^ bi)) < 0) {
            /* Signed overflow.  */
            di = (di < 0 ? INT64_MAX : INT64_MIN);
        }
        *(int64_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}